

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-log.c
# Opt level: O2

void borg_display_item(object *item2,wchar_t n)

{
  borg_item_conflict *item;
  borg_item_conflict *pbVar1;
  undefined8 in_RAX;
  char *pcVar2;
  undefined8 uStack_28;
  bitflag f [5];
  
  pbVar1 = borg_items;
  item = borg_items + n;
  uStack_28 = in_RAX;
  object_flags(item2,f);
  Term_clear();
  prt(item->desc,L'\x02',L'\0');
  pcVar2 = format("kind = %-5lu  level = %-4d  tval = %-5d  sval = %-5d",(ulong)pbVar1[n].kind,
                  (ulong)pbVar1[n].level,(ulong)pbVar1[n].tval,(ulong)pbVar1[n].sval);
  prt(pcVar2,L'\x04',L'\0');
  pcVar2 = format("number = %-3d  wgt = %-6d  ac = %-5d    damage = %dd%d",(ulong)pbVar1[n].iqty,
                  (ulong)(uint)(int)pbVar1[n].weight,(ulong)(uint)(int)pbVar1[n].ac,
                  (ulong)pbVar1[n].dd,(ulong)pbVar1[n].ds);
  prt(pcVar2,L'\x05',L'\0');
  pcVar2 = format("pval = %-5d  toac = %-5d  tohit = %-4d  todam = %-4d",
                  (ulong)(uint)(int)pbVar1[n].pval,(ulong)(uint)(int)pbVar1[n].to_a,
                  (ulong)(uint)(int)pbVar1[n].to_h,(ulong)(uint)(int)pbVar1[n].to_d);
  prt(pcVar2,L'\x06',L'\0');
  pcVar2 = format("name1 = %-4d  name2 = %-4d  value = %ld   cursed = %d   can uncurse = %d",
                  (ulong)pbVar1[n].art_idx,(ulong)pbVar1[n].ego_idx,(long)pbVar1[n].value,
                  (ulong)pbVar1[n].cursed,(ulong)pbVar1[n].uncursable);
  prt(pcVar2,L'\a',L'\0');
  pcVar2 = format("ident = %d      timeout = %-d",(ulong)pbVar1[n].ident,
                  (ulong)(uint)(int)pbVar1[n].timeout);
  prt(pcVar2,L'\b',L'\0');
  pcVar2 = borg_get_note(item);
  pcVar2 = format("Inscription: %s, chance: %d",pcVar2,
                  (ulong)(borg.trait[0x38] - (uint)pbVar1[n].level));
  prt(pcVar2,L'\t',L'\0');
  prt("+------------FLAGS1------------+",L'\n',L'\0');
  prt("AFFECT..........SLAY.......BRAND",L'\v',L'\0');
  prt("                ae      xxxpaefc",L'\f',L'\0');
  prt("siwdcc  ssidsasmnvudotgddduoclio",L'\r',L'\0');
  prt("tnieoh  trnipthgiinmrrnrrmniierl",L'\x0e',L'\0');
  prt("rtsxna..lcfgdkttmldncltggndsdced",L'\x0f',L'\0');
  if (pbVar1[n].ident == true) {
    borg_prt_binary((uint)f[0],L'\x10',L'\0');
  }
  prt("+------------FLAGS2------------+",L'\x11',L'\0');
  prt("SUST........IMM.RESIST.........",L'\x12',L'\0');
  prt("            afecaefcpfldbc s n  ",L'\x13',L'\0');
  prt("siwdcc      cilocliooeialoshnecd",L'\x14',L'\0');
  prt("tnieoh      irelierliatrnnnrethi",L'\x15',L'\0');
  prt("rtsxna......decddcedsrekdfddxhss",L'\x16',L'\0');
  if (item->ident == true) {
    borg_prt_binary((uint)f[1],L'\x17',L'\0');
  }
  prt("+------------FLAGS3------------+",L'\n',L' ');
  prt("s   ts h     tadiiii   aiehs  hp",L'\v',L' ');
  prt("lf  eefo     egrgggg  bcnaih  vr",L'\f',L' ');
  prt("we  lerln   ilgannnn  ltssdo  ym",L'\r',L' ');
  prt("da reiedo   merirrrr  eityew ccc",L'\x0e',L' ');
  prt("itlepnelf   ppanaefc  svaktm uuu",L'\x0f',L' ');
  prt("ghigavaiu   aoveclio  saanyo rrr",L'\x10',L' ');
  prt("seteticfe   craxierl  etropd sss",L'\x11',L' ');
  prt("trenhstel   tttpdced  detwes eee",L'\x12',L' ');
  if (item->ident == true) {
    borg_prt_binary((uint)f[2],L'\x13',L' ');
  }
  return;
}

Assistant:

void borg_display_item(struct object *item2, int n)
{
    int j = 0;

    bitflag f[OF_SIZE];

    borg_item *item;

    item = &borg_items[n];

    /* Extract the flags */
    object_flags(item2, f);

    /* Clear screen */
    Term_clear();

    /* Describe fully */
    prt(item->desc, 2, j);

    prt(format("kind = %-5lu  level = %-4d  tval = %-5d  sval = %-5d",
            (unsigned long)item->kind, item->level, item->tval, item->sval),
        4, j);

    prt(format("number = %-3d  wgt = %-6d  ac = %-5d    damage = %dd%d",
            item->iqty, item->weight, item->ac, item->dd, item->ds),
        5, j);

    prt(format("pval = %-5d  toac = %-5d  tohit = %-4d  todam = %-4d",
            item->pval, item->to_a, item->to_h, item->to_d),
        6, j);

    prt(format("name1 = %-4d  name2 = %-4d  value = %ld   cursed = %d   can "
               "uncurse = %d",
            item->art_idx, item->ego_idx, (long)item->value, item->cursed,
            item->uncursable),
        7, j);

    prt(format("ident = %d      timeout = %-d", item->ident, item->timeout), 8,
        j);

    /* maybe print the inscription */
    prt(format("Inscription: %s, chance: %d", borg_get_note(item),
            borg.trait[BI_DEV] - item->level),
        9, j);

    prt("+------------FLAGS1------------+", 10, j);
    prt("AFFECT..........SLAY.......BRAND", 11, j);
    prt("                ae      xxxpaefc", 12, j);
    prt("siwdcc  ssidsasmnvudotgddduoclio", 13, j);
    prt("tnieoh  trnipthgiinmrrnrrmniierl", 14, j);
    prt("rtsxna..lcfgdkttmldncltggndsdced", 15, j);
    if (item->ident)
        borg_prt_binary(f[0], 16, j);

    prt("+------------FLAGS2------------+", 17, j);
    prt("SUST........IMM.RESIST.........", 18, j);
    prt("            afecaefcpfldbc s n  ", 19, j);
    prt("siwdcc      cilocliooeialoshnecd", 20, j);
    prt("tnieoh      irelierliatrnnnrethi", 21, j);
    prt("rtsxna......decddcedsrekdfddxhss", 22, j);
    if (item->ident)
        borg_prt_binary(f[1], 23, j);

    prt("+------------FLAGS3------------+", 10, j + 32);
    prt("s   ts h     tadiiii   aiehs  hp", 11, j + 32);
    prt("lf  eefo     egrgggg  bcnaih  vr", 12, j + 32);
    prt("we  lerln   ilgannnn  ltssdo  ym", 13, j + 32);
    prt("da reiedo   merirrrr  eityew ccc", 14, j + 32);
    prt("itlepnelf   ppanaefc  svaktm uuu", 15, j + 32);
    prt("ghigavaiu   aoveclio  saanyo rrr", 16, j + 32);
    prt("seteticfe   craxierl  etropd sss", 17, j + 32);
    prt("trenhstel   tttpdced  detwes eee", 18, j + 32);
    if (item->ident)
        borg_prt_binary(f[2], 19, j + 32);
}